

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O2

Orphan<capnp::DynamicValue> * __thiscall
capnp::TextCodec::decode
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,TextCodec *this,StringPtr input,
          Type type,Orphanage orphanage)

{
  Builder result;
  Reader src;
  Orphanage orphanageParam;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  IVar1;
  StringPtr message;
  ArrayPtr<const_char> input_00;
  ThrowingErrorReporter errorReporter;
  Fault f;
  Orphan<capnp::DynamicValue> local_448;
  ParserInput parserInput;
  NullableValue<capnp::Orphan<capnp::compiler::Expression>_> expression;
  Builder lexedTokens;
  ExternalResolver nullResolver;
  ThrowingErrorReporter errorReporter_1;
  NullableValue<capnp::Orphan<capnp::DynamicValue>_> local_378;
  Reader local_338;
  Reader tokens;
  ValueTranslator local_2d8;
  MallocMessageBuilder tokenArena;
  CapnpParser parser;
  
  __return_storage_ptr__->type = UNKNOWN;
  (__return_storage_ptr__->builder).tag.content = 0;
  (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
  (__return_storage_ptr__->builder).location = (word *)0x0;
  errorReporter.super_ErrorReporter._vptr_ErrorReporter = (ErrorReporter)&PTR_addError_00675e90;
  MallocMessageBuilder::MallocMessageBuilder(&tokenArena,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::compiler::LexedTokens>
            (&lexedTokens,&tokenArena.super_MessageBuilder);
  result._builder.capTable = lexedTokens._builder.capTable;
  result._builder.segment = lexedTokens._builder.segment;
  result._builder.data = lexedTokens._builder.data;
  result._builder.pointers = lexedTokens._builder.pointers;
  result._builder.dataSize = lexedTokens._builder.dataSize;
  result._builder.pointerCount = lexedTokens._builder.pointerCount;
  result._builder._38_2_ = lexedTokens._builder._38_2_;
  input_00.size_ = input.content.size_ - 1;
  input_00.ptr = input.content.ptr;
  capnp::compiler::lex(input_00,result,&errorReporter.super_ErrorReporter);
  orphanageParam = MessageBuilder::getOrphanage(&tokenArena.super_MessageBuilder);
  capnp::compiler::CapnpParser::CapnpParser
            (&parser,orphanageParam,&errorReporter.super_ErrorReporter);
  capnp::_::StructBuilder::asReader(&lexedTokens._builder);
  capnp::compiler::LexedTokens::Reader::getTokens(&tokens,(Reader *)&f);
  parserInput.parent =
       (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
        *)0x0;
  parserInput.pos.index = 0;
  parserInput.end.index = tokens.reader.elementCount;
  parserInput.best.index = 0;
  parserInput.pos.container = &tokens;
  parserInput.end.container = &tokens;
  parserInput.best.container = &tokens;
  if (tokens.reader.elementCount == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
               ,0x57,FAILED,(char *)0x0,"\"Failed to read input.\"",
               (char (*) [22])"Failed to read input.");
    kj::_::Debug::Fault::fatal(&f);
  }
  (*(code *)**(undefined8 **)parser.parsers.expression.wrapper)
            (&f,parser.parsers.expression.wrapper,parser.parsers.expression.parser);
  kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::NullableValue
            (&expression,(NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *)&f);
  kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::~NullableValue
            ((NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *)&f);
  if (expression.isSet == true) {
    if (parserInput.pos.index != tokens.reader.elementCount) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x4b,FAILED,"parserInput.getPosition() == tokens.end()",
                 "\"Extra tokens in input.\"",(char (*) [23])"Extra tokens in input.");
      kj::_::Debug::Fault::fatal(&f);
    }
    capnp::_::OrphanGetImpl<capnp::compiler::Expression,_(capnp::Kind)3>::applyReader
              (&local_338,&expression.field_1.value.builder);
    local_2d8.errorReporter = &errorReporter_1.super_ErrorReporter;
    errorReporter_1.super_ErrorReporter._vptr_ErrorReporter = (ErrorReporter)&PTR_addError_00675e90;
    local_2d8.resolver = &nullResolver.super_Resolver;
    nullResolver.super_Resolver._vptr_Resolver = (Resolver)&PTR_resolveConstant_00675ec8;
    local_2d8.orphanage.arena = orphanage.arena;
    local_2d8.orphanage.capTable = orphanage.capTable;
    src._reader.capTable = local_338._reader.capTable;
    src._reader.segment = local_338._reader.segment;
    src._reader.data = local_338._reader.data;
    src._reader.pointers = local_338._reader.pointers;
    src._reader.dataSize = local_338._reader.dataSize;
    src._reader.pointerCount = local_338._reader.pointerCount;
    src._reader._38_2_ = local_338._reader._38_2_;
    src._reader.nestingLimit = local_338._reader.nestingLimit;
    src._reader._44_4_ = local_338._reader._44_4_;
    capnp::compiler::ValueTranslator::compileValue
              ((Maybe<capnp::Orphan<capnp::DynamicValue>_> *)&local_378,&local_2d8,src,type);
    kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::NullableValue
              ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)&f,&local_378);
    kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::~NullableValue(&local_378);
    if ((char)f.exception == '\x01') {
      Orphan<capnp::DynamicValue>::operator=(__return_storage_ptr__,&local_448);
    }
    kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::~NullableValue
              ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)&f);
  }
  else {
    IVar1 = kj::parse::
            IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
            ::getBest(&parserInput);
    local_378._0_8_ = IVar1.container;
    local_378.field_1.value.type = IVar1.index;
    if (local_378.field_1.value.type == tokens.reader.elementCount) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x51,FAILED,(char *)0x0,"\"Premature end of input.\"",
                 (char (*) [24])"Premature end of input.");
      kj::_::Debug::Fault::fatal(&f);
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
    ::operator*((Reader *)&f,
                (IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                 *)&local_378);
    message.content.size_ = 0xc;
    message.content.ptr = "Parse error";
    capnp::compiler::ErrorReporter::addErrorOn<capnp::compiler::Token::Reader>
              (&errorReporter.super_ErrorReporter,(Reader *)&f,message);
  }
  kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::~NullableValue(&expression);
  kj::parse::
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  ::~IteratorInput(&parserInput);
  capnp::compiler::CapnpParser::~CapnpParser(&parser);
  MallocMessageBuilder::~MallocMessageBuilder(&tokenArena);
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> TextCodec::decode(kj::StringPtr input, Type type, Orphanage orphanage) const {
  Orphan<DynamicValue> output;
  
  lexAndParseExpression(input, [&type, &orphanage, &output](compiler::Expression::Reader expression) {
    ThrowingErrorReporter errorReporter;
    ExternalResolver nullResolver;

    compiler::ValueTranslator translator(nullResolver, errorReporter, orphanage);
    KJ_IF_MAYBE(value, translator.compileValue(expression, type)) {
      output = *kj::mv(value);
    } else {
      // An error should have already been given to the errorReporter.
    }
  });
  
  return output;
}